

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::RandomUniformStaticLayerParams::MergeFrom
          (RandomUniformStaticLayerParams *this,RandomUniformStaticLayerParams *from)

{
  float fVar1;
  int iVar2;
  void *pvVar3;
  LogMessage *pLVar4;
  LogFinisher local_89;
  LogMessage local_88;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xe4d8);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar3 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar3 & 0xfffffffffffffffe));
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_88,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       (&local_88,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_89,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(&local_88);
  }
  iVar2 = (from->outputshape_).current_size_;
  if (iVar2 != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve
              (&this->outputshape_,iVar2 + (this->outputshape_).current_size_);
    memcpy(((this->outputshape_).rep_)->elements + (this->outputshape_).current_size_,
           ((from->outputshape_).rep_)->elements,(long)(from->outputshape_).current_size_ << 3);
    (this->outputshape_).current_size_ =
         (this->outputshape_).current_size_ + (from->outputshape_).current_size_;
  }
  if (from->seed_ != 0) {
    this->seed_ = from->seed_;
  }
  fVar1 = from->minval_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    this->minval_ = fVar1;
  }
  fVar1 = from->maxval_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    this->maxval_ = fVar1;
  }
  return;
}

Assistant:

void RandomUniformStaticLayerParams::MergeFrom(const RandomUniformStaticLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.RandomUniformStaticLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  outputshape_.MergeFrom(from.outputshape_);
  if (from.seed() != 0) {
    set_seed(from.seed());
  }
  if (from.minval() != 0) {
    set_minval(from.minval());
  }
  if (from.maxval() != 0) {
    set_maxval(from.maxval());
  }
}